

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aspif_text.cpp
# Opt level: O2

void __thiscall Potassco::AspifTextInput::matchAgg(AspifTextInput *this)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  
  bVar1 = match(this,"{",true);
  if ((bVar1) && (bVar1 = match(this,"}",false), !bVar1)) {
    do {
      uVar2 = matchLit(this);
      bVar1 = match(this,"=",false);
      uVar4 = 0x100000000;
      if (bVar1) {
        uVar3 = matchInt(this);
        uVar4 = (ulong)uVar3 << 0x20;
      }
      RuleBuilder::addGoal(&this->data_->rule,(WeightLit_t)(uVar2 | uVar4));
      bVar1 = match(this,",",false);
    } while (bVar1);
    match(this,"}",true);
    return;
  }
  return;
}

Assistant:

void AspifTextInput::matchAgg() {
	if (match("{") && !match("}", false)) {
		do {
			WeightLit_t wl = {matchLit(), 1};
			if (match("=", false)) { wl.weight = matchInt(); }
			data_->rule.addGoal(wl);
		}
		while (match(",", false));
		match("}");
	}
}